

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O3

void __thiscall Deck::~Deck(Deck *this)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  pointer pCVar2;
  
  operator_delete(this->deckSize,4);
  pvVar1 = this->deckPointer;
  if ((pvVar1 != (vector<CardType,_std::allocator<CardType>_> *)0x0) &&
     (pCVar2 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_start, pCVar2 != (pointer)0x0)) {
    operator_delete(pCVar2,(long)(pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  operator_delete(pvVar1,0x18);
  pvVar1 = this->discardPointer;
  if ((pvVar1 != (vector<CardType,_std::allocator<CardType>_> *)0x0) &&
     (pCVar2 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_start, pCVar2 != (pointer)0x0)) {
    operator_delete(pCVar2,(long)(pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar2);
  }
  operator_delete(pvVar1,0x18);
  return;
}

Assistant:

Deck::~Deck() {
    delete deckSize;
    delete deckPointer;
    delete discardPointer;
}